

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

bool nonsugar::detail::starts_with<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s2)

{
  char *__first1;
  bool bVar1;
  
  if (s1->_M_string_length < s2->_M_string_length) {
    return false;
  }
  __first1 = (s2->_M_dataplus)._M_p;
  bVar1 = std::__equal<true>::equal<char>
                    (__first1,__first1 + s2->_M_string_length,(s1->_M_dataplus)._M_p);
  return bVar1;
}

Assistant:

inline bool starts_with(String const &s1, String const &s2)
{
    return s1.size() >= s2.size() && std::equal(s2.begin(), s2.end(), s1.begin());
}